

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O0

_Bool borg_think_home_grab_useless(void)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  int32_t iVar4;
  borg_item_conflict *item_00;
  borg_item_conflict *item;
  int hole;
  _Bool skip_it;
  int charge_each;
  int qty;
  int32_t b_s;
  int32_t s;
  int b_n;
  int n;
  int p;
  
  b_s = -1;
  hole = 0;
  bVar1 = false;
  wVar2 = borg_first_empty_inventory_slot();
  if (wVar2 == L'\xffffffff') {
    n._3_1_ = false;
  }
  else if (wVar2 + L'\x01' < (int)((uint)z_info->pack_size - borg.trait[0x9e])) {
    borg_notice_home((borg_item_conflict *)0x0,false);
    charge_each = borg_power_home();
    for (s = 0; s < (int)(uint)z_info->store_inven_max; s = s + 1) {
      item_00 = borg_shops[7].ware + s;
      if (item_00->iqty != '\0') {
        for (b_n = 0; b_n < sold_item_num; b_n = b_n + 1) {
          if (((sold_item_tval[b_n] == (uint)item_00->tval) &&
              (sold_item_sval[b_n] == (uint)item_00->sval)) && (sold_item_store[b_n] == 7)) {
            bVar1 = true;
          }
        }
        if (!bVar1) {
          if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
            hole = (int)item_00->pval / (int)(uint)item_00->iqty;
          }
          iVar3 = borg_min_item_quantity(item_00);
          borg_shops[7].ware[s].iqty = borg_shops[7].ware[s].iqty - (char)iVar3;
          if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
            borg_shops[7].ware[s].pval = borg_shops[7].ware[s].pval - (short)hole * (short)iVar3;
          }
          borg_notice_home((borg_item_conflict *)0x0,false);
          iVar4 = borg_power_home();
          memcpy(borg_shops[7].ware + s,borg_safe_shops[7].ware + s,0x388);
          if (charge_each <= iVar4) {
            b_s = s;
            charge_each = iVar4;
          }
        }
      }
    }
    borg_notice_home((borg_item_conflict *)0x0,false);
    borg_power_home();
    if (b_s < 0) {
      n._3_1_ = false;
    }
    else {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)b_s;
      n._3_1_ = true;
    }
  }
  else {
    n._3_1_ = false;
  }
  return n._3_1_;
}

Assistant:

bool borg_think_home_grab_useless(void)
{
    int     p, n, b_n = -1;
    int32_t s, b_s = 0L;
    int     qty     = 1;
    int     charge_each = 0;
    bool    skip_it = false;
    int     hole    = borg_first_empty_inventory_slot();

    /* Require two empty slots */
    if (hole == -1)
        return false;
    if (hole + 1 >= PACK_SLOTS)
        return false;

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    b_s = borg_power_home();

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip stuff if we sold bought it */
        for (p = 0; p < sold_item_num; p++) {
            if (sold_item_tval[p] == item->tval
                && sold_item_sval[p] == item->sval
                && sold_item_store[p] == BORG_HOME)
                skip_it = true;
        }
        if (skip_it == true)
            continue;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= charge_each * qty;

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* Evaluate the home */
        s = borg_power_home();

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Ignore "bad" sales */
        if (s < b_s)
            continue;

        /* Maintain the "best" */
        b_n = n;
        b_s = s;
    }

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    s = borg_power_home();

    /* Stockpile */
    if (b_n >= 0) {
        /* Visit the home */
        borg.goal.shop = BORG_HOME;

        /* Grab that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Assume not */
    return false;
}